

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void av1_fdwt8x8_uint8_input_c(uint8_t *input,tran_low_t *output,int stride,int hbd)

{
  int iVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  ulong uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  tran_low_t *ptVar13;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  int iVar23;
  tran_low_t *ptVar24;
  tran_low_t buffer [128];
  int local_238 [130];
  
  if (hbd == 0) {
    lVar17 = 0;
    ptVar13 = output;
    do {
      lVar9 = 0;
      do {
        ptVar13[lVar9] = (uint)input[lVar9] << 2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      lVar17 = lVar17 + 1;
      ptVar13 = ptVar13 + 8;
      input = input + stride;
    } while (lVar17 != 8);
  }
  else {
    lVar17 = (long)input * 2;
    lVar9 = 0;
    ptVar13 = output;
    do {
      lVar18 = 0;
      do {
        uVar15 = *(ulong *)(lVar17 + lVar18 * 2);
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar15;
        auVar2._12_2_ = (short)(uVar15 >> 0x30);
        auVar3._8_2_ = (short)(uVar15 >> 0x20);
        auVar3._0_8_ = uVar15;
        auVar3._10_4_ = auVar2._10_4_;
        auVar5._6_8_ = 0;
        auVar5._0_6_ = auVar3._8_6_;
        auVar4._4_2_ = (short)(uVar15 >> 0x10);
        auVar4._0_4_ = (uint)uVar15;
        auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
        ptVar24 = ptVar13 + lVar18;
        *ptVar24 = ((uint)uVar15 & 0xffff) << 2;
        ptVar24[1] = auVar4._4_4_ << 2;
        ptVar24[2] = auVar3._8_4_ << 2;
        ptVar24[3] = (auVar2._10_4_ >> 0x10) << 2;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 8);
      lVar9 = lVar9 + 1;
      lVar17 = lVar17 + (long)stride * 2;
      ptVar13 = ptVar13 + 8;
    } while (lVar9 != 8);
  }
  iVar8 = 0;
  uVar15 = 4;
  uVar21 = 8;
  uVar16 = 8;
  uVar11 = 4;
  do {
    uVar6 = uVar15;
    iVar23 = (uVar16 >> 1) - 1;
    ptVar13 = output + uVar11;
    uVar15 = 0;
    ptVar24 = output;
    do {
      piVar22 = output + uVar15 * 8;
      memcpy(local_238,piVar22,(ulong)uVar16 * 4);
      piVar7 = piVar22 + uVar11;
      piVar10 = local_238;
      piVar14 = piVar7;
      if (iVar23 != 0) {
        lVar17 = 0;
        piVar14 = local_238;
        iVar12 = iVar23;
        do {
          piVar10 = piVar14;
          lVar9 = lVar17 * 2;
          piVar14 = (int *)((long)local_238 + lVar9 + 8);
          iVar1 = *(int *)((long)local_238 + lVar9);
          *(int *)((long)ptVar24 + lVar17) = iVar1 * 2;
          *(int *)((long)ptVar13 + lVar17) =
               *(int *)((long)local_238 + lVar9 + 4) - (iVar1 + *piVar14 + 1 >> 1);
          lVar17 = lVar17 + 4;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        piVar10 = piVar10 + 2;
        piVar14 = (int *)((long)ptVar13 + lVar17);
        piVar22 = (int *)(lVar17 + (long)ptVar24);
      }
      iVar12 = *piVar10;
      *piVar22 = iVar12 * 2;
      *piVar14 = piVar10[1] - iVar12;
      lVar17 = 0;
      piVar14 = piVar7;
      do {
        piVar10 = piVar7;
        ptVar24[lVar17] = ptVar24[lVar17] + (*piVar14 + *piVar10 + 1 >> 1);
        lVar17 = lVar17 + 1;
        piVar7 = piVar10 + 1;
        piVar14 = piVar10;
      } while (uVar16 >> 1 != (uint)lVar17);
      uVar15 = uVar15 + 1;
      ptVar13 = ptVar13 + 8;
      ptVar24 = ptVar24 + 8;
    } while (uVar15 != uVar21);
    piVar7 = local_238 + uVar21;
    piVar14 = local_238 + uVar6;
    iVar23 = (int)(uVar21 >> 1) + -1;
    uVar15 = 0;
    ptVar13 = output;
    do {
      uVar20 = 0;
      piVar10 = ptVar13;
      do {
        piVar7[uVar20] = *piVar10;
        uVar20 = uVar20 + 1;
        piVar10 = piVar10 + 8;
      } while (uVar21 != uVar20);
      piVar22 = local_238;
      piVar19 = piVar7;
      piVar10 = piVar14;
      iVar12 = iVar23;
      if (iVar23 != 0) {
        do {
          iVar1 = *piVar19;
          *piVar22 = iVar1;
          piVar22[uVar6] = (piVar19[1] * 2 - (iVar1 + piVar19[2])) + 2 >> 2;
          piVar22 = piVar22 + 1;
          piVar19 = piVar19 + 2;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        piVar10 = piVar22 + uVar6;
      }
      iVar12 = *piVar19;
      *piVar22 = iVar12;
      *piVar10 = (piVar19[1] - iVar12) + 1 >> 1;
      if (1 < (uint)uVar21) {
        lVar17 = 0;
        piVar10 = piVar14;
        do {
          *(int *)((long)local_238 + lVar17) =
               *(int *)((long)local_238 + lVar17) +
               (*piVar10 + *(int *)((long)piVar14 + lVar17) + 1 >> 1);
          piVar10 = (int *)((long)piVar14 + lVar17);
          lVar17 = lVar17 + 4;
        } while (((uint)uVar21 * 2 & 0xfffffffc) != (uint)lVar17);
      }
      lVar17 = 0;
      uVar20 = uVar21;
      do {
        ptVar13[lVar17 * 2] = *(int *)((long)local_238 + lVar17);
        lVar17 = lVar17 + 4;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
      uVar15 = uVar15 + 1;
      ptVar13 = ptVar13 + 1;
    } while (uVar15 != uVar16);
    iVar8 = iVar8 + 1;
    uVar15 = (ulong)((int)uVar6 + 1U >> 1);
    uVar21 = uVar6;
    uVar16 = uVar11;
    uVar11 = uVar11 + 1 >> 1;
  } while (iVar8 != 3);
  return;
}

Assistant:

static void dyadic_analyze_53_uint8_input(int levels, int width, int height,
                                          const uint8_t *x, int pitch_x,
                                          tran_low_t *c, int pitch_c,
                                          int dwt_scale_bits, int hbd) {
  int lv, i, j, nh, nw, hh = height, hw = width;
  tran_low_t buffer[2 * DWT_MAX_LENGTH];

  if (hbd) {
    const uint16_t *x16 = CONVERT_TO_SHORTPTR(x);
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x16[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  } else {
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  }

  for (lv = 0; lv < levels; lv++) {
    nh = hh;
    hh = (hh + 1) >> 1;
    nw = hw;
    hw = (hw + 1) >> 1;
    if ((nh < 2) || (nw < 2)) return;
    for (i = 0; i < nh; i++) {
      memcpy(buffer, &c[i * pitch_c], nw * sizeof(tran_low_t));
      analysis_53_row(nw, buffer, &c[i * pitch_c], &c[i * pitch_c] + hw);
    }
    for (j = 0; j < nw; j++) {
      for (i = 0; i < nh; i++) buffer[i + nh] = c[i * pitch_c + j];
      analysis_53_col(nh, buffer + nh, buffer, buffer + hh);
      for (i = 0; i < nh; i++) c[i * pitch_c + j] = buffer[i];
    }
  }
}